

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

Config * Config::load(Config *__return_storage_ptr__,string *file)

{
  _Base_ptr this;
  _Rb_tree_node_base *p_Var1;
  SamplePublisher *pSVar2;
  _Head_base<0UL,_SamplePublisher_*,_false> _Var3;
  _Head_base<0UL,_SoftBitPublisher_*,_false> _Var4;
  _Head_base<0UL,_PacketPublisher_*,_false> _Var5;
  _Alloc_hider _Var6;
  _Head_base<0UL,_SamplePublisher_*,_false> _Var7;
  bool bVar8;
  return_type_conflict rVar9;
  return_type rVar10;
  uint32_t uVar11;
  return_type pmVar12;
  _Base_ptr p_Var13;
  Value *pVVar14;
  invalid_argument *piVar15;
  Config *pCVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  _Base_ptr __lhs;
  return_type_conflict1 rVar17;
  allocator local_249;
  string local_248;
  _Rb_tree_node_base *local_228;
  StatsPublisher *local_220;
  StatsPublisher *local_218;
  string *local_210;
  string *local_208;
  _Base_ptr local_200;
  _Base_ptr local_1f8;
  Config *local_1f0;
  stringstream ss;
  ostream local_1d8 [376];
  ParseResult pr;
  
  Config(__return_storage_ptr__);
  toml::parseFile(&pr,file);
  if (pr.value.type_ == NULL_TYPE) {
    piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar15,(string *)&pr.errorReason);
    __cxa_throw(piVar15,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pmVar12 = toml::Value::
            as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                      (&pr.value);
  p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_200 = &(pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_210 = (string *)&__return_storage_ptr__->monitor;
  local_220 = &(__return_storage_ptr__->decoder).statsPublisher;
  local_208 = (string *)&(__return_storage_ptr__->nanomsg).connect;
  local_218 = &(__return_storage_ptr__->demodulator).statsPublisher;
  local_1f0 = (Config *)&(__return_storage_ptr__->demodulator).source;
  do {
    if (p_Var13 == local_200) {
      std::__cxx11::string::string
                ((string *)&ss,"inproc://demodulator_stats",(allocator *)&local_248);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::string((string *)&ss,"inproc://decoder_stats",(allocator *)&local_248);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __return_storage_ptr__,"lrit");
      if (bVar8) {
        if ((__return_storage_ptr__->airspy).frequency == 0) {
          (__return_storage_ptr__->airspy).frequency = 0x64ca9cc0;
        }
        if ((__return_storage_ptr__->rtlsdr).frequency == 0) {
          (__return_storage_ptr__->rtlsdr).frequency = 0x64ca9cc0;
        }
      }
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __return_storage_ptr__,"hrit");
      if (bVar8) {
        if ((__return_storage_ptr__->airspy).frequency == 0) {
          (__return_storage_ptr__->airspy).frequency = 0x64f9ea20;
        }
        if ((__return_storage_ptr__->rtlsdr).frequency == 0) {
          (__return_storage_ptr__->rtlsdr).frequency = 0x64f9ea20;
        }
      }
      toml::ParseResult::~ParseResult(&pr);
      return __return_storage_ptr__;
    }
    __lhs = p_Var13 + 1;
    this = p_Var13 + 2;
    local_1f8 = p_Var13;
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"demodulator");
    if (bVar8) {
      pmVar12 = toml::Value::
                as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                          ((Value *)this);
      for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
        __lhs = p_Var13 + 1;
        p_Var1 = p_Var13 + 2;
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"mode");
        if (bVar8) {
          toml::Value::as<std::__cxx11::string>((Value *)p_Var1);
          pCVar16 = __return_storage_ptr__;
LAB_0012c849:
          std::__cxx11::string::_M_assign((string *)pCVar16);
        }
        else {
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"source");
          if (bVar8) {
            toml::Value::as<std::__cxx11::string>((Value *)p_Var1);
            pCVar16 = local_1f0;
            goto LAB_0012c849;
          }
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"stats_publisher");
          if (bVar8) {
            anon_unknown.dwarf_17339::createStatsPublisher((StatsPublisher *)&ss,(Value *)p_Var1);
            StatsPublisher::operator=(local_218,(StatsPublisher *)&ss);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ss);
          }
          else {
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"decimation");
            if (!bVar8) goto LAB_0012d37e;
            rVar10 = toml::Value::as<int>((Value *)p_Var1);
            (__return_storage_ptr__->demodulator).decimation = rVar10;
          }
        }
      }
    }
    else {
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"airspy");
      if (bVar8) {
        pmVar12 = toml::Value::
                  as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                            ((Value *)this);
        for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          __lhs = p_Var13 + 1;
          p_Var1 = p_Var13 + 2;
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"frequency");
          if (bVar8) {
            uVar11 = toml::Value::as<int>((Value *)p_Var1);
            (__return_storage_ptr__->airspy).frequency = uVar11;
          }
          else {
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"sample_rate");
            if (bVar8) {
              uVar11 = toml::Value::as<int>((Value *)p_Var1);
              (__return_storage_ptr__->airspy).sampleRate = uVar11;
            }
            else {
              bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"gain");
              if (bVar8) {
                rVar10 = toml::Value::as<int>((Value *)p_Var1);
                (__return_storage_ptr__->airspy).gain = (uint8_t)rVar10;
              }
              else {
                bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"sample_publisher");
                if (bVar8) {
                  anon_unknown.dwarf_17339::createSamplePublisher
                            ((anon_unknown_dwarf_17339 *)&ss,(Value *)p_Var1);
                  _Var6._M_p = (pointer)_ss;
                  _ss = (SamplePublisher *)0x0;
                  pSVar2 = (__return_storage_ptr__->airspy).samplePublisher._M_t.
                           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                           .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                  (__return_storage_ptr__->airspy).samplePublisher._M_t.
                  super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>._M_t
                  .super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>.
                  super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                       (SamplePublisher *)_Var6._M_p;
                  if ((pSVar2 != (SamplePublisher *)0x0) &&
                     ((**(code **)((long)(pSVar2->super_Publisher)._vptr_Publisher + 8))(),
                     _ss != (SamplePublisher *)0x0)) {
                    (**(code **)(*(long *)_ss + 8))();
                  }
                }
                else {
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"bias_tee");
                  if (!bVar8) goto LAB_0012d37e;
                  rVar9 = toml::Value::as<bool>((Value *)p_Var1);
                  (__return_storage_ptr__->airspy).bias_tee = rVar9;
                }
              }
            }
          }
        }
      }
      else {
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"rtlsdr");
        if (bVar8) {
          pmVar12 = toml::Value::
                    as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                              ((Value *)this);
          for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
            __lhs = p_Var13 + 1;
            p_Var1 = p_Var13 + 2;
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"frequency");
            if (bVar8) {
              uVar11 = toml::Value::as<int>((Value *)p_Var1);
              (__return_storage_ptr__->rtlsdr).frequency = uVar11;
            }
            else {
              bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"sample_rate");
              if (bVar8) {
                uVar11 = toml::Value::as<int>((Value *)p_Var1);
                (__return_storage_ptr__->rtlsdr).sampleRate = uVar11;
              }
              else {
                bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"gain");
                if (bVar8) {
                  rVar10 = toml::Value::as<int>((Value *)p_Var1);
                  (__return_storage_ptr__->rtlsdr).gain = (uint8_t)rVar10;
                }
                else {
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"sample_publisher");
                  if (bVar8) {
                    anon_unknown.dwarf_17339::createSamplePublisher
                              ((anon_unknown_dwarf_17339 *)&ss,(Value *)p_Var1);
                    _Var6._M_p = (pointer)_ss;
                    _ss = (SamplePublisher *)0x0;
                    pSVar2 = (__return_storage_ptr__->rtlsdr).samplePublisher._M_t.
                             super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                             .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                    (__return_storage_ptr__->rtlsdr).samplePublisher._M_t.
                    super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                    .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                         (SamplePublisher *)_Var6._M_p;
                    if ((pSVar2 != (SamplePublisher *)0x0) &&
                       ((**(code **)((long)(pSVar2->super_Publisher)._vptr_Publisher + 8))(),
                       _ss != (SamplePublisher *)0x0)) {
                      (**(code **)(*(long *)_ss + 8))();
                    }
                  }
                  else {
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"bias_tee");
                    if (bVar8) {
                      rVar9 = toml::Value::as<bool>((Value *)p_Var1);
                      (__return_storage_ptr__->rtlsdr).bias_tee = rVar9;
                    }
                    else {
                      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__lhs,"device_index");
                      if (!bVar8) goto LAB_0012d37e;
                      uVar11 = toml::Value::as<int>((Value *)p_Var1);
                      (__return_storage_ptr__->rtlsdr).deviceIndex = uVar11;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"nanomsg");
          if (bVar8) {
            pmVar12 = toml::Value::
                      as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                ((Value *)this);
            for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
                p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
              __lhs = p_Var13 + 1;
              p_Var1 = p_Var13 + 2;
              bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"sample_rate");
              if (bVar8) {
                uVar11 = toml::Value::as<int>((Value *)p_Var1);
                (__return_storage_ptr__->nanomsg).sampleRate = uVar11;
              }
              else {
                bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"connect");
                if (bVar8) {
                  toml::Value::as<std::__cxx11::string>((Value *)p_Var1);
                  std::__cxx11::string::_M_assign(local_208);
                }
                else {
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"receive_buffer");
                  if (bVar8) {
                    rVar10 = toml::Value::as<int>((Value *)p_Var1);
                    (__return_storage_ptr__->nanomsg).receiveBuffer = (long)rVar10;
                  }
                  else {
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"sample_publisher");
                    if (!bVar8) goto LAB_0012d37e;
                    anon_unknown.dwarf_17339::createSamplePublisher
                              ((anon_unknown_dwarf_17339 *)&ss,(Value *)p_Var1);
                    _Var6._M_p = (pointer)_ss;
                    _ss = (SamplePublisher *)0x0;
                    pSVar2 = (__return_storage_ptr__->nanomsg).samplePublisher._M_t.
                             super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                             .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                    (__return_storage_ptr__->nanomsg).samplePublisher._M_t.
                    super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                    .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                         (SamplePublisher *)_Var6._M_p;
                    if ((pSVar2 != (SamplePublisher *)0x0) &&
                       ((**(code **)((long)(pSVar2->super_Publisher)._vptr_Publisher + 8))(),
                       _ss != (SamplePublisher *)0x0)) {
                      (**(code **)(*(long *)_ss + 8))();
                    }
                  }
                }
              }
            }
            if ((__return_storage_ptr__->nanomsg).sampleRate == 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&ss);
              std::operator<<(local_1d8,"Key not set: sample_rate");
              piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::invalid_argument::invalid_argument(piVar15,(string *)&local_248);
              __cxa_throw(piVar15,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
          }
          else {
            bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"agc");
            if (bVar8) {
              pmVar12 = toml::Value::
                        as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                  ((Value *)this);
              for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
                  p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                __lhs = p_Var13 + 1;
                p_Var1 = p_Var13 + 2;
                bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"min");
                if (bVar8) {
                  rVar17 = toml::Value::as<double>((Value *)p_Var1);
                  (__return_storage_ptr__->agc).min = (float)rVar17;
                }
                else {
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"max");
                  if (bVar8) {
                    rVar17 = toml::Value::as<double>((Value *)p_Var1);
                    (__return_storage_ptr__->agc).max = (float)rVar17;
                  }
                  else {
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"sample_publisher");
                    if (!bVar8) goto LAB_0012d37e;
                    anon_unknown.dwarf_17339::createSamplePublisher
                              ((anon_unknown_dwarf_17339 *)&ss,(Value *)p_Var1);
                    _Var6._M_p = (pointer)_ss;
                    _ss = (SamplePublisher *)0x0;
                    pSVar2 = (__return_storage_ptr__->agc).samplePublisher._M_t.
                             super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                             .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                    (__return_storage_ptr__->agc).samplePublisher._M_t.
                    super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                    .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                         (SamplePublisher *)_Var6._M_p;
                    if ((pSVar2 != (SamplePublisher *)0x0) &&
                       ((**(code **)((long)(pSVar2->super_Publisher)._vptr_Publisher + 8))(),
                       _ss != (SamplePublisher *)0x0)) {
                      (**(code **)(*(long *)_ss + 8))();
                    }
                  }
                }
              }
            }
            else {
              bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"costas");
              if (bVar8) {
                pmVar12 = toml::Value::
                          as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                    ((Value *)this);
                for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                  __lhs = p_Var13 + 1;
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"max_deviation");
                  if (bVar8) {
                    rVar17 = toml::Value::as<double>((Value *)(p_Var13 + 2));
                    (__return_storage_ptr__->costas).maxDeviation = (int)rVar17;
                    if ((int)rVar17 < 1) goto LAB_0012d386;
                  }
                  else {
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"sample_publisher");
                    if (!bVar8) goto LAB_0012d37e;
                    anon_unknown.dwarf_17339::createSamplePublisher
                              ((anon_unknown_dwarf_17339 *)&ss,(Value *)(p_Var13 + 2));
                    _Var6._M_p = (pointer)_ss;
                    _ss = (SamplePublisher *)0x0;
                    pSVar2 = (__return_storage_ptr__->costas).samplePublisher._M_t.
                             super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                             .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                    (__return_storage_ptr__->costas).samplePublisher._M_t.
                    super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                    .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                         (SamplePublisher *)_Var6._M_p;
                    if ((pSVar2 != (SamplePublisher *)0x0) &&
                       ((**(code **)((long)(pSVar2->super_Publisher)._vptr_Publisher + 8))(),
                       _ss != (SamplePublisher *)0x0)) {
                      (**(code **)(*(long *)_ss + 8))();
                    }
                  }
                }
              }
              else {
                bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"rrc");
                if (bVar8) {
                  pmVar12 = toml::Value::
                            as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                      ((Value *)this);
                  for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                      (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
                      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                    __lhs = p_Var13 + 1;
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"sample_publisher");
                    if (!bVar8) goto LAB_0012d37e;
                    anon_unknown.dwarf_17339::createSamplePublisher
                              ((anon_unknown_dwarf_17339 *)&ss,(Value *)(p_Var13 + 2));
                    _Var7._M_head_impl = _ss;
                    _ss = (SamplePublisher *)0x0;
                    _Var3._M_head_impl =
                         (__return_storage_ptr__->rrc).samplePublisher._M_t.
                         super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                         .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                    (__return_storage_ptr__->rrc).samplePublisher._M_t.
                    super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                    .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                         _Var7._M_head_impl;
                    if ((_Var3._M_head_impl != (SamplePublisher *)0x0) &&
                       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_Publisher + 8))(),
                       _ss != (SamplePublisher *)0x0)) {
                      (**(code **)(*(long *)_ss + 8))();
                    }
                  }
                }
                else {
                  bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"clock_recovery");
                  if (bVar8) {
                    pmVar12 = toml::Value::
                              as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                        ((Value *)this);
                    for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                        (_Rb_tree_header *)p_Var13 != &(pmVar12->_M_t)._M_impl.super__Rb_tree_header
                        ; p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                      __lhs = p_Var13 + 1;
                      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__lhs,"sample_publisher");
                      if (!bVar8) goto LAB_0012d37e;
                      anon_unknown.dwarf_17339::createSamplePublisher
                                ((anon_unknown_dwarf_17339 *)&ss,(Value *)(p_Var13 + 2));
                      _Var7._M_head_impl = _ss;
                      _ss = (SamplePublisher *)0x0;
                      _Var3._M_head_impl =
                           (__return_storage_ptr__->clockRecovery).samplePublisher._M_t.
                           super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                           .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl;
                      (__return_storage_ptr__->clockRecovery).samplePublisher._M_t.
                      super___uniq_ptr_impl<SamplePublisher,_std::default_delete<SamplePublisher>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_SamplePublisher_*,_std::default_delete<SamplePublisher>_>
                      .super__Head_base<0UL,_SamplePublisher_*,_false>._M_head_impl =
                           _Var7._M_head_impl;
                      if ((_Var3._M_head_impl != (SamplePublisher *)0x0) &&
                         ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_Publisher + 8))(),
                         _ss != (SamplePublisher *)0x0)) {
                        (**(code **)(*(long *)_ss + 8))();
                      }
                    }
                  }
                  else {
                    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__lhs,"quantization");
                    if (bVar8) {
                      pmVar12 = toml::Value::
                                as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                          ((Value *)this);
                      local_228 = &(pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header;
                      for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                          ; p_Var13 != local_228;
                          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                        __lhs = p_Var13 + 1;
                        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)__lhs,"soft_bit_publisher");
                        if (!bVar8) goto LAB_0012d37e;
                        std::__cxx11::string::string((string *)&ss,"bind",(allocator *)&local_248);
                        pVVar14 = toml::Value::find((Value *)(p_Var13 + 2),(string *)&ss);
                        std::__cxx11::string::~string((string *)&ss);
                        if (pVVar14 == (Value *)0x0) {
                          piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar15,"Expected publisher section to have \"bind\" key");
                          goto LAB_0012d3a0;
                        }
                        toml::Value::as<std::__cxx11::string>(pVVar14);
                        SoftBitPublisher::create(&local_248);
                        std::__cxx11::string::string((string *)&ss,"send_buffer",&local_249);
                        pVVar14 = toml::Value::find((Value *)(p_Var13 + 2),(string *)&ss);
                        std::__cxx11::string::~string((string *)&ss);
                        _Var6._M_p = local_248._M_dataplus._M_p;
                        if (pVVar14 != (Value *)0x0) {
                          rVar10 = toml::Value::as<int>(pVVar14);
                          Publisher::setSendBuffer((Publisher *)_Var6._M_p,rVar10);
                        }
                        _Var6._M_p = local_248._M_dataplus._M_p;
                        local_248._M_dataplus._M_p = (pointer)0x0;
                        _Var4._M_head_impl =
                             (__return_storage_ptr__->quantization).softBitPublisher._M_t.
                             super___uniq_ptr_impl<SoftBitPublisher,_std::default_delete<SoftBitPublisher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SoftBitPublisher_*,_std::default_delete<SoftBitPublisher>_>
                             .super__Head_base<0UL,_SoftBitPublisher_*,_false>._M_head_impl;
                        (__return_storage_ptr__->quantization).softBitPublisher._M_t.
                        super___uniq_ptr_impl<SoftBitPublisher,_std::default_delete<SoftBitPublisher>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SoftBitPublisher_*,_std::default_delete<SoftBitPublisher>_>
                        .super__Head_base<0UL,_SoftBitPublisher_*,_false>._M_head_impl =
                             (SoftBitPublisher *)_Var6._M_p;
                        if ((_Var4._M_head_impl != (SoftBitPublisher *)0x0) &&
                           ((**(code **)(*(long *)&(_Var4._M_head_impl)->super_Publisher + 8))(),
                           (Publisher *)local_248._M_dataplus._M_p != (Publisher *)0x0)) {
                          (**(code **)(*(long *)local_248._M_dataplus._M_p + 8))();
                        }
                      }
                    }
                    else {
                      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)__lhs,"decoder");
                      if (bVar8) {
                        pmVar12 = toml::Value::
                                  as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                            ((Value *)this);
                        local_228 = &(pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header;
                        for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                       _M_left; p_Var13 != local_228;
                            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                          __lhs = p_Var13 + 1;
                          p_Var1 = p_Var13 + 2;
                          bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"packet_publisher");
                          if (bVar8) {
                            std::__cxx11::string::string
                                      ((string *)&ss,"bind",(allocator *)&local_248);
                            pVVar14 = toml::Value::find((Value *)p_Var1,(string *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            if (pVVar14 == (Value *)0x0) {
                              piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
                              std::invalid_argument::invalid_argument
                                        (piVar15,"Expected publisher section to have \"bind\" key");
                              goto LAB_0012d3a0;
                            }
                            toml::Value::as<std::__cxx11::string>(pVVar14);
                            PacketPublisher::create(&local_248);
                            std::__cxx11::string::string((string *)&ss,"send_buffer",&local_249);
                            pVVar14 = toml::Value::find((Value *)p_Var1,(string *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            _Var6._M_p = local_248._M_dataplus._M_p;
                            if (pVVar14 != (Value *)0x0) {
                              rVar10 = toml::Value::as<int>(pVVar14);
                              Publisher::setSendBuffer((Publisher *)_Var6._M_p,rVar10);
                            }
                            _Var6._M_p = local_248._M_dataplus._M_p;
                            local_248._M_dataplus._M_p = (pointer)0x0;
                            _Var5._M_head_impl =
                                 (__return_storage_ptr__->decoder).packetPublisher._M_t.
                                 super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>
                                 .super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl;
                            (__return_storage_ptr__->decoder).packetPublisher._M_t.
                            super___uniq_ptr_impl<PacketPublisher,_std::default_delete<PacketPublisher>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_PacketPublisher_*,_std::default_delete<PacketPublisher>_>
                            .super__Head_base<0UL,_PacketPublisher_*,_false>._M_head_impl =
                                 (PacketPublisher *)_Var6._M_p;
                            if ((_Var5._M_head_impl != (PacketPublisher *)0x0) &&
                               ((**(code **)(*(long *)&(_Var5._M_head_impl)->super_Publisher + 8))()
                               , (Publisher *)local_248._M_dataplus._M_p != (Publisher *)0x0)) {
                              (**(code **)(*(long *)local_248._M_dataplus._M_p + 8))();
                            }
                          }
                          else {
                            bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"stats_publisher");
                            if (!bVar8) goto LAB_0012d37e;
                            anon_unknown.dwarf_17339::createStatsPublisher
                                      ((StatsPublisher *)&ss,(Value *)p_Var1);
                            StatsPublisher::operator=(local_220,(StatsPublisher *)&ss);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)&ss);
                          }
                        }
                      }
                      else {
                        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)__lhs,"monitor");
                        if (!bVar8) {
LAB_0012d37e:
                          anon_unknown.dwarf_17339::throwInvalidKey((string *)__lhs);
LAB_0012d386:
                          piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar15,"Expected \'max_deviation\' to be positive");
LAB_0012d3a0:
                          __cxa_throw(piVar15,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                        pmVar12 = toml::Value::
                                  as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                            ((Value *)this);
                        for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                       _M_left;
                            (_Rb_tree_header *)p_Var13 !=
                            &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
                            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
                          __lhs = p_Var13 + 1;
                          bVar8 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs,"statsd_address");
                          if (!bVar8) goto LAB_0012d37e;
                          toml::Value::as<std::__cxx11::string>((Value *)(p_Var13 + 2));
                          std::__cxx11::string::_M_assign(local_210);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_1f8);
  } while( true );
}

Assistant:

Config Config::load(const std::string& file) {
  Config out;

  auto pr = toml::parseFile(file);
  if (!pr.valid()) {
    throw std::invalid_argument(pr.errorReason);
  }

  const auto& table = pr.value.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "demodulator") {
      loadDemodulator(out.demodulator, value);
      continue;
    }

    if (key == "airspy") {
      loadAirspySource(out.airspy, value);
      continue;
    }

    if (key == "rtlsdr") {
      loadRTLSDRSource(out.rtlsdr, value);
      continue;
    }

    if (key == "nanomsg") {
      loadNanomsgSource(out.nanomsg, value);
      continue;
    }

    if (key == "agc") {
      loadAGC(out.agc, value);
      continue;
    }

    if (key == "costas") {
      loadCostas(out.costas, value);
      continue;
    }

    if (key == "rrc") {
      loadRRC(out.rrc, value);
      continue;
    }

    if (key == "clock_recovery") {
      loadClockRecovery(out.clockRecovery, value);
      continue;
    }

    if (key == "quantization") {
      loadQuantization(out.quantization, value);
      continue;
    }

    if (key == "decoder") {
      loadDecoder(out.decoder, value);
      continue;
    }

    if (key == "monitor") {
      loadMonitor(out.monitor, value);
      continue;
    }

    throwInvalidKey(key);
  }

  const auto demodulatorStatsEndpoint = "inproc://demodulator_stats";
  const auto decoderStatsEndpoint = "inproc://decoder_stats";

  // Add inproc endpoints for the stats publishers
  out.demodulator.statsPublisher.bind.push_back(demodulatorStatsEndpoint);
  out.decoder.statsPublisher.bind.push_back(decoderStatsEndpoint);

  // If the mode field is used, we can populate sane defaults
  if (out.demodulator.downlinkType == "lrit") {
    setIfZero(out.airspy.frequency, 1691000000u);
    setIfZero(out.rtlsdr.frequency, 1691000000u);
  }
  if (out.demodulator.downlinkType == "hrit") {
    setIfZero(out.airspy.frequency, 1694100000u);
    setIfZero(out.rtlsdr.frequency, 1694100000u);
  }

  return out;
}